

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void av1_superres_upscale(AV1_COMMON *cm,BufferPool *pool,_Bool alloc_pyramid)

{
  RefCntBuffer *pRVar1;
  int iVar2;
  YV12_BUFFER_CONFIG *src;
  byte in_DL;
  int unaff_EBX;
  aom_get_frame_buffer_cb_fn_t unaff_RBP;
  long in_RSI;
  AV1_COMMON *in_RDI;
  aom_codec_frame_buffer_t *unaff_R14;
  void *unaff_retaddr;
  int in_stack_00000010;
  void *cb_priv;
  aom_get_frame_buffer_cb_fn_t cb;
  aom_release_frame_buffer_cb_fn_t release_fb_cb;
  aom_codec_frame_buffer_t *fb;
  int aligned_width;
  YV12_BUFFER_CONFIG *frame_to_show;
  YV12_BUFFER_CONFIG copy_buffer;
  int byte_alignment;
  SequenceHeader *seq_params;
  int num_planes;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffea0;
  uint uVar5;
  ulong uVar4;
  YV12_BUFFER_CONFIG *dst;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 alloc_pyramid_00;
  int in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffec8;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffed0;
  code *pcVar6;
  undefined1 local_110 [16];
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff83;
  int in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  aom_color_primaries_t in_stack_ffffffffffffff8c;
  aom_transfer_characteristics_t in_stack_ffffffffffffff90;
  aom_matrix_coefficients_t in_stack_ffffffffffffff94;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff98;
  
  alloc_pyramid_00 = (undefined1)((uint)in_stack_fffffffffffffeb8 >> 0x18);
  uVar5 = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  av1_num_planes(in_RDI);
  iVar2 = av1_superres_scaled(in_RDI);
  if (iVar2 != 0) {
    memset(local_110,0,0xd0);
    src = &in_RDI->cur_frame->buf;
    uVar4 = (ulong)uVar5 << 0x20;
    iVar2 = aom_alloc_frame_buffer
                      (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                       (int)in_stack_fffffffffffffec8,
                       (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                       (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                       in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,(_Bool)alloc_pyramid_00,
                       in_stack_ffffffffffffff18);
    if (iVar2 != 0) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate copy buffer for superres upscaling");
    }
    aom_yv12_copy_frame_c
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    if (in_RSI == 0) {
      copy_buffer_config(src,(YV12_BUFFER_CONFIG *)local_110);
      uVar3 = 0x120;
      dst = (YV12_BUFFER_CONFIG *)(uVar4 & 0xffffffff00000000);
      iVar2 = aom_alloc_frame_buffer
                        (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                         (int)in_stack_fffffffffffffec8,
                         (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                         (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,(_Bool)alloc_pyramid_00
                         ,in_stack_ffffffffffffff18);
      if (iVar2 != 0) {
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to reallocate current frame buffer for superres upscaling");
      }
      copy_buffer_config((YV12_BUFFER_CONFIG *)local_110,src);
    }
    else {
      pRVar1 = in_RDI->cur_frame;
      pcVar6 = *(code **)(in_RSI + 0x38);
      dst = *(YV12_BUFFER_CONFIG **)(in_RSI + 0x30);
      in_stack_fffffffffffffea8 = *(YV12_BUFFER_CONFIG **)(in_RSI + 0x28);
      lock_buffer_pool((BufferPool *)0x6da3f2);
      iVar2 = (*pcVar6)(in_stack_fffffffffffffea8,&pRVar1->raw_frame_buffer);
      if (iVar2 != 0) {
        unlock_buffer_pool((BufferPool *)0x6da415);
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to free current frame buffer before superres upscaling");
      }
      uVar3 = 0x120;
      in_stack_fffffffffffffeb0 = (uint)(in_DL & 1);
      iVar2 = aom_realloc_frame_buffer
                        (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,(int)in_RDI,unaff_EBX,
                         unaff_R14,unaff_RBP,unaff_retaddr,(_Bool)in_stack_ffffffffffffff83,
                         in_stack_00000010);
      if (iVar2 != 0) {
        unlock_buffer_pool((BufferPool *)0x6da4d5);
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate current frame buffer for superres upscaling");
      }
      unlock_buffer_pool((BufferPool *)0x6da501);
    }
    upscale_normative_and_extend_frame
              ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8,dst);
    aom_free_frame_buffer((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_fffffffffffffe8c,uVar3));
  }
  return;
}

Assistant:

void av1_superres_upscale(AV1_COMMON *cm, BufferPool *const pool,
                          bool alloc_pyramid) {
  const int num_planes = av1_num_planes(cm);
  if (!av1_superres_scaled(cm)) return;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int byte_alignment = cm->features.byte_alignment;

  YV12_BUFFER_CONFIG copy_buffer;
  memset(&copy_buffer, 0, sizeof(copy_buffer));

  YV12_BUFFER_CONFIG *const frame_to_show = &cm->cur_frame->buf;

  const int aligned_width = ALIGN_POWER_OF_TWO(cm->width, 3);
  if (aom_alloc_frame_buffer(
          &copy_buffer, aligned_width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          AOM_BORDER_IN_PIXELS, byte_alignment, false, 0))
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate copy buffer for superres upscaling");

  // Copy function assumes the frames are the same size.
  // Note that it does not copy YV12_BUFFER_CONFIG config data.
  aom_yv12_copy_frame(frame_to_show, &copy_buffer, num_planes);

  assert(copy_buffer.y_crop_width == aligned_width);
  assert(copy_buffer.y_crop_height == cm->height);

  // Realloc the current frame buffer at a higher resolution in place.
  if (pool != NULL) {
    // Use callbacks if on the decoder.
    aom_codec_frame_buffer_t *fb = &cm->cur_frame->raw_frame_buffer;
    aom_release_frame_buffer_cb_fn_t release_fb_cb = pool->release_fb_cb;
    aom_get_frame_buffer_cb_fn_t cb = pool->get_fb_cb;
    void *cb_priv = pool->cb_priv;

    lock_buffer_pool(pool);
    // Realloc with callback does not release the frame buffer - release first.
    if (release_fb_cb(cb_priv, fb)) {
      unlock_buffer_pool(pool);
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to free current frame buffer before superres upscaling");
    }
    // aom_realloc_frame_buffer() leaves config data for frame_to_show intact
    if (aom_realloc_frame_buffer(
            frame_to_show, cm->superres_upscaled_width,
            cm->superres_upscaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            AOM_BORDER_IN_PIXELS, byte_alignment, fb, cb, cb_priv,
            alloc_pyramid, 0)) {
      unlock_buffer_pool(pool);
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to allocate current frame buffer for superres upscaling");
    }
    unlock_buffer_pool(pool);
  } else {
    // Make a copy of the config data for frame_to_show in copy_buffer
    copy_buffer_config(frame_to_show, &copy_buffer);

    // Don't use callbacks on the encoder.
    // aom_alloc_frame_buffer() clears the config data for frame_to_show
    if (aom_alloc_frame_buffer(
            frame_to_show, cm->superres_upscaled_width,
            cm->superres_upscaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            AOM_BORDER_IN_PIXELS, byte_alignment, alloc_pyramid, 0))
      aom_internal_error(
          cm->error, AOM_CODEC_MEM_ERROR,
          "Failed to reallocate current frame buffer for superres upscaling");

    // Restore config data back to frame_to_show
    copy_buffer_config(&copy_buffer, frame_to_show);
  }
  // TODO(afergs): verify frame_to_show is correct after realloc
  //               encoder:
  //               decoder:

  assert(frame_to_show->y_crop_width == cm->superres_upscaled_width);
  assert(frame_to_show->y_crop_height == cm->superres_upscaled_height);

  // Scale up and back into frame_to_show.
  assert(frame_to_show->y_crop_width != cm->width);
  upscale_normative_and_extend_frame(cm, &copy_buffer, frame_to_show);

  // Free the copy buffer
  aom_free_frame_buffer(&copy_buffer);
}